

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O3

pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
* __thiscall
spvtools::opt::LoopFusion::GetLoadsAndStoresInLoop
          (pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
           *__return_storage_ptr__,LoopFusion *this,Loop *loop)

{
  uint32_t uVar1;
  Function *pFVar2;
  BasicBlock *pBVar3;
  pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  *ppVar4;
  uint32_t uVar5;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *this_00;
  Instruction *instruction;
  Instruction *pIVar6;
  _Hash_node_base *p_Var7;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar8;
  Instruction *local_80;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_78;
  pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  *local_60;
  LoopFusion *local_58;
  Loop *local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  local_78.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var7 = (loop->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  local_60 = __return_storage_ptr__;
  local_58 = this;
  local_50 = loop;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    do {
      uVar1 = *(uint32_t *)&p_Var7[1]._M_nxt;
      pIVar6 = (local_50->loop_continue_->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar5 = 0;
      if (pIVar6->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
      }
      if (uVar1 != uVar5) {
        pFVar2 = local_58->containing_function_;
        UVar8 = std::
                __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                          (&pFVar2->blocks_,
                           (pFVar2->blocks_).
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,&pFVar2->blocks_,
                           (pFVar2->blocks_).
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,uVar1);
        pBVar3 = ((UVar8.iterator_._M_current._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        for (pIVar6 = *(Instruction **)
                       ((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                       0x10);
            pIVar6 != (Instruction *)
                      ((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)
            ; pIVar6 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
          this_00 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                     *)&local_48;
          if ((pIVar6->opcode_ == OpStore) ||
             (this_00 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                         *)&local_78, pIVar6->opcode_ == OpLoad)) {
            local_80 = pIVar6;
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            emplace_back<spvtools::opt::Instruction*>(this_00,&local_80);
          }
        }
      }
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  ppVar4 = local_60;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            (&local_60->first,&local_78);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            (&ppVar4->second,&local_48);
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return ppVar4;
}

Assistant:

std::pair<std::vector<Instruction*>, std::vector<Instruction*>>
LoopFusion::GetLoadsAndStoresInLoop(Loop* loop) {
  std::vector<Instruction*> loads{};
  std::vector<Instruction*> stores{};

  for (auto block_id : loop->GetBlocks()) {
    if (block_id == loop->GetContinueBlock()->id()) {
      continue;
    }

    for (auto& instruction : *containing_function_->FindBlock(block_id)) {
      if (instruction.opcode() == spv::Op::OpLoad) {
        loads.push_back(&instruction);
      } else if (instruction.opcode() == spv::Op::OpStore) {
        stores.push_back(&instruction);
      }
    }
  }

  return std::make_pair(loads, stores);
}